

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_call(dmr_C *C,expression *expr)

{
  expression *expr_00;
  expression_list *head;
  int iVar1;
  int iVar2;
  symbol *psVar3;
  char *pcVar4;
  undefined1 local_68 [8];
  ptr_list_iter argiter__;
  expression *arg;
  expression_list *arglist;
  expression *fn;
  symbol *sym;
  symbol *ctype;
  int fnargs;
  int args;
  expression *expr_local;
  dmr_C *C_local;
  
  expr_00 = (expr->field_5).field_3.unop;
  head = (expr->field_5).field_11.args;
  psVar3 = dmrC_evaluate_expression(C,expr_00);
  if (psVar3 == (symbol *)0x0) {
    C_local = (dmr_C *)0x0;
  }
  else {
    psVar3 = expr_00->ctype;
    sym = psVar3;
    if (((undefined1  [232])*psVar3 & (undefined1  [232])0xff) == (undefined1  [232])0x3) {
      sym = (psVar3->field_14).field_2.ctype.base_type;
    }
    if (((undefined1  [232])*sym & (undefined1  [232])0xff) == (undefined1  [232])0x4) {
      sym = dmrC_get_base_type(C->S,sym);
    }
    if (((undefined1  [232])*sym & (undefined1  [232])0xff) == (undefined1  [232])0x5) {
      examine_fn_arguments(C,sym);
      if ((((((undefined1  [232])*psVar3 & (undefined1  [232])0xff) == (undefined1  [232])0x3) &&
           ((undefined1  [64])((undefined1  [64])*expr_00 & (undefined1  [64])0xff) ==
            (undefined1  [64])0x9)) && (psVar3->op != (symbol_op *)0x0)) &&
         (psVar3->op->args != (_func_int_dmr_C_ptr_expression_ptr *)0x0)) {
        iVar1 = (*psVar3->op->args)(C,expr);
        if (iVar1 == 0) {
          return (symbol *)0x0;
        }
      }
      else {
        iVar1 = evaluate_arguments(C,sym,head);
        if (iVar1 == 0) {
          return (symbol *)0x0;
        }
        iVar1 = dmrC_expression_list_size((expr->field_5).field_11.args);
        iVar2 = dmrC_symbol_list_size((sym->field_14).field_2.arguments);
        if (iVar1 < iVar2) {
          pcVar4 = dmrC_show_ident(C,psVar3->ident);
          dmrC_expression_error(C,expr,"not enough arguments for function %s",pcVar4);
        }
        if ((iVar2 < iVar1) && ((*(uint *)((long)&sym->field_14 + 0xc) >> 0x12 & 1) == 0)) {
          pcVar4 = dmrC_show_ident(C,psVar3->ident);
          dmrC_expression_error(C,expr,"too many arguments for function %s",pcVar4);
        }
      }
      if ((((undefined1  [232])*psVar3 & (undefined1  [232])0xff) == (undefined1  [232])0x3) &&
         (iVar1 = evaluate_symbol_call(C,expr), iVar1 != 0)) {
        C_local = (dmr_C *)expr->ctype;
      }
      else {
        expr->ctype = (sym->field_14).field_2.ctype.base_type;
        C_local = (dmr_C *)expr->ctype;
      }
    }
    else {
      pcVar4 = dmrC_show_ident(C,psVar3->ident);
      dmrC_expression_error(C,expr,"not a function %s",pcVar4);
      ptrlist_forward_iterator((ptr_list_iter *)local_68,(ptr_list *)head);
      argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_68);
      while (argiter__._16_8_ != 0) {
        dmrC_evaluate_expression(C,(expression *)argiter__._16_8_);
        argiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_68);
      }
      C_local = (dmr_C *)0x0;
    }
  }
  return (symbol *)C_local;
}

Assistant:

static struct symbol *evaluate_call(struct dmr_C *C, struct expression *expr)
{
	int args, fnargs;
	struct symbol *ctype, *sym;
	struct expression *fn = expr->fn;
	struct expression_list *arglist = expr->args;

	if (!dmrC_evaluate_expression(C, fn))
		return NULL;
	sym = ctype = fn->ctype;
	if (ctype->type == SYM_NODE)
		ctype = ctype->ctype.base_type;
	if (ctype->type == SYM_PTR)
		ctype = dmrC_get_base_type(C->S, ctype);

	if (ctype->type != SYM_FN) {
		struct expression *arg;
		dmrC_expression_error(C, expr, "not a function %s",
			     dmrC_show_ident(C, sym->ident));
		/* do typechecking in arguments */
		FOR_EACH_PTR (arglist, arg) {
			dmrC_evaluate_expression(C, arg);
		} END_FOR_EACH_PTR(arg);
		return NULL;
	}

	examine_fn_arguments(C, ctype);
	if (sym->type == SYM_NODE && fn->type == EXPR_PREOP &&
	    sym->op && sym->op->args) {
		if (!sym->op->args(C, expr))
			return NULL;
	} else {
		if (!evaluate_arguments(C, ctype, arglist))
			return NULL;
		args = dmrC_expression_list_size(expr->args);
		fnargs = dmrC_symbol_list_size(ctype->arguments);
		if (args < fnargs)
			dmrC_expression_error(C, expr,
				     "not enough arguments for function %s",
				     dmrC_show_ident(C, sym->ident));
		if (args > fnargs && !ctype->variadic)
			dmrC_expression_error(C, expr,
				     "too many arguments for function %s",
				     dmrC_show_ident(C, sym->ident));
	}
	if (sym->type == SYM_NODE) {
		if (evaluate_symbol_call(C, expr))
			return expr->ctype;
	}
	expr->ctype = ctype->ctype.base_type;
	return expr->ctype;
}